

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataPtr xmlNewAutomata(void)

{
  xmlRegStatePtr pxVar1;
  xmlAutomataPtr ctxt;
  
  ctxt = xmlRegNewParserCtxt((xmlChar *)0x0);
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
    ctxt = (xmlAutomataPtr)0x0;
  }
  else {
    pxVar1 = xmlRegStatePush(ctxt);
    ctxt->state = pxVar1;
    if (ctxt->state == (xmlRegStatePtr)0x0) {
      xmlFreeAutomata(ctxt);
      ctxt = (xmlAutomataPtr)0x0;
    }
    else {
      ctxt->start = ctxt->state;
      ctxt->end = (xmlRegStatePtr)0x0;
      ctxt->start->type = XML_REGEXP_START_STATE;
      ctxt->flags = 0;
    }
  }
  return ctxt;
}

Assistant:

xmlAutomataPtr
xmlNewAutomata(void) {
    xmlAutomataPtr ctxt;

    ctxt = xmlRegNewParserCtxt(NULL);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->state = xmlRegStatePush(ctxt);
    if (ctxt->state == NULL) {
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->start = ctxt->state;
    ctxt->end = NULL;

    ctxt->start->type = XML_REGEXP_START_STATE;
    ctxt->flags = 0;

    return(ctxt);
}